

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

float * Eigen::internal::conditional_aligned_new_auto<float,true>(size_t size)

{
  float *result;
  size_t size_local;
  
  if (size == 0) {
    size_local = 0;
  }
  else {
    if (0x3fffffffffffffff < size) {
      throw_std_bad_alloc();
    }
    size_local = (size_t)conditional_aligned_malloc<true>(size << 2);
  }
  return (float *)size_local;
}

Assistant:

inline T* conditional_aligned_new_auto(size_t size)
{
  if(size==0)
    return 0; // short-cut. Also fixes Bug 884
  check_size_for_overflow<T>(size);
  T *result = reinterpret_cast<T*>(conditional_aligned_malloc<Align>(sizeof(T)*size));
  if(NumTraits<T>::RequireInitialization)
    construct_elements_of_array(result, size);
  return result;
}